

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicizeWrap
               (TtCanonicizeFunc func,Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,
               int flag)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  int iVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar14 [16];
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  char pCanonPerm2 [16];
  char local_48 [24];
  
  bVar1 = (byte)nVars;
  uVar5 = 1 << (bVar1 - 6 & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  if (nVars < 6) {
    uVar4 = 1 << (bVar1 & 0x1f);
    uVar8 = ~(-1L << ((byte)uVar4 & 0x3f));
    uVar9 = *pTruth & uVar8;
    *pTruth = uVar9;
    auVar13 = _DAT_0093d220;
    if ((uint)nVars < 6) {
      uVar2 = uVar4 * 2;
      uVar6 = (ulong)uVar2;
      uVar17 = 0x40;
      if (0x40 < uVar6) {
        uVar17 = uVar6;
      }
      uVar7 = ((uVar17 - uVar6) - (ulong)(nVars != 5) >> (bVar1 & 0x3f)) + (ulong)(nVars != 5);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar9;
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      auVar27._8_4_ = (int)uVar9;
      auVar27._0_8_ = uVar9;
      auVar27._12_4_ = (int)(uVar9 >> 0x20);
      uVar6 = 0xfffffffffffffffe;
      uVar17 = CONCAT44(0,uVar4);
      lVar19 = (ulong)uVar4 * 2;
      do {
        auVar23 = auVar21;
        auVar22._8_8_ = auVar27._8_8_ << lVar19;
        auVar22._0_8_ = uVar9 << uVar17;
        auVar21 = auVar22 | auVar23;
        uVar17 = uVar17 + uVar2;
        lVar19 = lVar19 + (ulong)uVar2;
        uVar6 = uVar6 + 2;
      } while ((uVar7 & 0xfffffffffffffffe) != uVar6);
      auVar26._8_4_ = (int)uVar6;
      auVar26._0_8_ = uVar6;
      auVar26._12_4_ = (int)(uVar6 >> 0x20);
      auVar10 = auVar10 ^ _DAT_0093d220;
      auVar27 = (auVar26 | _DAT_0093d210) ^ _DAT_0093d220;
      iVar30 = -(uint)(auVar10._0_4_ < auVar27._0_4_);
      iVar15 = auVar10._4_4_;
      auVar31._4_4_ = -(uint)(iVar15 < auVar27._4_4_);
      iVar32 = -(uint)(auVar10._8_4_ < auVar27._8_4_);
      iVar16 = auVar10._12_4_;
      auVar31._12_4_ = -(uint)(iVar16 < auVar27._12_4_);
      auVar33._4_4_ = iVar30;
      auVar33._0_4_ = iVar30;
      auVar33._8_4_ = iVar32;
      auVar33._12_4_ = iVar32;
      auVar28._4_4_ = -(uint)(auVar27._4_4_ == iVar15);
      auVar28._12_4_ = -(uint)(auVar27._12_4_ == iVar16);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar31 = auVar31 | auVar28 & auVar33;
      auVar21 = ~auVar31 & auVar21 | auVar23 & auVar31;
      uVar17 = auVar21._8_8_ | auVar21._0_8_;
      *pTruth = uVar17;
      uVar8 = uVar8 & uVar17;
      auVar11._8_8_ = (ulong)uVar4 * 2;
      auVar11._0_8_ = CONCAT44(0,uVar4);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar8;
      auVar29._8_4_ = (int)uVar8;
      auVar29._0_8_ = uVar8;
      auVar29._12_4_ = (int)(uVar8 >> 0x20);
      uVar9 = 0xfffffffffffffffe;
      do {
        auVar21 = auVar23;
        lVar19 = auVar11._8_8_;
        auVar34._8_4_ = auVar11._8_4_;
        auVar34._0_8_ = lVar19;
        auVar34._12_4_ = auVar11._12_4_;
        auVar24._8_8_ = auVar29._8_8_ << auVar34._8_8_;
        auVar24._0_8_ = uVar8 << auVar11._0_8_;
        auVar23 = auVar24 | auVar21;
        auVar11._0_8_ = auVar11._0_8_ + (ulong)(uVar4 * 2);
        auVar11._8_8_ = lVar19 + (ulong)(uVar4 * 2);
        uVar9 = uVar9 + 2;
      } while ((uVar7 & 0xfffffffffffffffe) != uVar9);
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar12 | _DAT_0093d210) ^ auVar13;
      iVar30 = -(uint)(auVar10._0_4_ < auVar13._0_4_);
      iVar32 = -(uint)(iVar15 < auVar13._4_4_);
      iVar18 = -(uint)(auVar10._8_4_ < auVar13._8_4_);
      iVar20 = -(uint)(iVar16 < auVar13._12_4_);
      auVar25._4_4_ = iVar30;
      auVar25._0_4_ = iVar30;
      auVar25._8_4_ = iVar18;
      auVar25._12_4_ = iVar18;
      iVar15 = -(uint)(auVar13._4_4_ == iVar15);
      iVar16 = -(uint)(auVar13._12_4_ == iVar16);
      auVar13._4_4_ = iVar15;
      auVar13._0_4_ = iVar15;
      auVar13._8_4_ = iVar16;
      auVar13._12_4_ = iVar16;
      auVar14._4_4_ = iVar32;
      auVar14._0_4_ = iVar32;
      auVar14._8_4_ = iVar20;
      auVar14._12_4_ = iVar20;
      auVar14 = auVar14 | auVar13 & auVar25;
      auVar13 = ~auVar14 & auVar23 | auVar21 & auVar14;
      if (uVar17 != (auVar13._8_8_ | auVar13._0_8_)) {
        __assert_fail("*pTruth == nTruth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
      }
    }
  }
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
    uVar8 = 0;
    iVar15 = 0;
    do {
      uVar17 = pTruth[uVar8];
      if (uVar17 != 0) {
        uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
        uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
        uVar17 = (uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f;
        uVar17 = (uVar17 >> 8) + uVar17;
        lVar19 = (uVar17 >> 0x10) + uVar17;
        iVar15 = iVar15 + ((int)((ulong)lVar19 >> 0x20) + (int)lVar19 & 0xffU);
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
    if (iVar15 == uVar5 << 5) {
      lVar19 = 0;
      do {
        *(ulong *)((long)Abc_TtCanonicizeWrap::pTruth2 + lVar19) =
             ~*(ulong *)((long)pTruth + lVar19);
        lVar19 = lVar19 + 8;
      } while (uVar9 * 8 - lVar19 != 0);
      uVar5 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
      uVar4 = (*func)(p,Abc_TtCanonicizeWrap::pTruth2,nVars,local_48,flag);
      uVar8 = uVar9;
      do {
        if ((int)uVar8 < 1) {
          return uVar5;
        }
        lVar3 = uVar8 + 0x3ff;
        lVar19 = uVar8 - 1;
        uVar8 = uVar8 - 1;
      } while (pTruth[lVar19] == Abc_TtCanonicizePhase::pCopy2[lVar3]);
      if (Abc_TtCanonicizePhase::pCopy2[lVar3] <= pTruth[lVar19]) {
        lVar19 = 0;
        do {
          *(undefined8 *)((long)pTruth + lVar19) =
               *(undefined8 *)((long)Abc_TtCanonicizeWrap::pTruth2 + lVar19);
          lVar19 = lVar19 + 8;
        } while (uVar9 * 8 - lVar19 != 0);
        memcpy(pCanonPerm,local_48,(long)nVars);
        uVar5 = uVar4;
      }
      return uVar5;
    }
  }
  uVar5 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
  return uVar5;
}

Assistant:

unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned uCanonPhase1, uCanonPhase2;
    char pCanonPerm2[16];
    static word pTruth2[1024];

    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    if (Abc_TtCountOnesInTruth(pTruth, nVars) != nWords * 32)
        return func(p, pTruth, nVars, pCanonPerm, flag);
    Abc_TtCopy(pTruth2, pTruth, nWords, 1);
    uCanonPhase1 = func(p, pTruth, nVars, pCanonPerm, flag);
    uCanonPhase2 = func(p, pTruth2, nVars, pCanonPerm2, flag);
    if (Abc_TtCompareRev(pTruth, pTruth2, nWords) <= 0)
        return uCanonPhase1;
    Abc_TtCopy(pTruth, pTruth2, nWords, 0);
    memcpy(pCanonPerm, pCanonPerm2, nVars);
    return uCanonPhase2;
}